

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O1

Vector<double,_3U> * __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::get95percentConfidenceInterval
          (Vector<double,_3U> *__return_storage_ptr__,Accumulator<OpenMD::Vector<double,_3U>_> *this
          )

{
  double dVar1;
  size_t i;
  long lVar2;
  double dVar3;
  Vector<double,_3U> stdDev;
  Vector<double,_3U> local_30;
  
  __return_storage_ptr__->data_[0] = 0.0;
  __return_storage_ptr__->data_[1] = 0.0;
  __return_storage_ptr__->data_[2] = 0.0;
  getStdDev(&local_30,this);
  lVar2 = 0;
  do {
    dVar1 = local_30.data_[lVar2];
    dVar3 = ((double)CONCAT44(0x45300000,(int)(this->Count_ >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->Count_) - 4503599627370496.0);
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    __return_storage_ptr__->data_[lVar2] = (dVar1 * 1.96) / dVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

Vector<RealType, Dim> get95percentConfidenceInterval() const {
      assert(Count_ != 0);

      Vector<RealType, Dim> ci {};
      Vector<RealType, Dim> stdDev = this->getStdDev();

      for (std::size_t i = 0; i < Dim; i++) {
        ci[i] = 1.960 * stdDev[i] / std::sqrt(static_cast<RealType>(Count_));
      }

      return ci;
    }